

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O1

void leopard::ff16::IFFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint64_t uVar9;
  long lVar10;
  ulong extraout_RDX;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  
  if (CpuHasAVX2 == '\x01') {
    lVar10 = (ulong)log_m * 0x100;
    auVar34 = *(undefined1 (*) [32])(Multiply256LUT + lVar10);
    auVar47 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + lVar10);
    auVar48 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + lVar10);
    auVar2 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + lVar10);
    auVar3 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + lVar10);
    auVar4 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + lVar10);
    auVar5 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + lVar10);
    auVar6 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + lVar10);
    uVar9 = 0;
    auVar49[8] = 0xf;
    auVar49._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar49[9] = 0xf;
    auVar49[10] = 0xf;
    auVar49[0xb] = 0xf;
    auVar49[0xc] = 0xf;
    auVar49[0xd] = 0xf;
    auVar49[0xe] = 0xf;
    auVar49[0xf] = 0xf;
    auVar49[0x10] = 0xf;
    auVar49[0x11] = 0xf;
    auVar49[0x12] = 0xf;
    auVar49[0x13] = 0xf;
    auVar49[0x14] = 0xf;
    auVar49[0x15] = 0xf;
    auVar49[0x16] = 0xf;
    auVar49[0x17] = 0xf;
    auVar49[0x18] = 0xf;
    auVar49[0x19] = 0xf;
    auVar49[0x1a] = 0xf;
    auVar49[0x1b] = 0xf;
    auVar49[0x1c] = 0xf;
    auVar49[0x1d] = 0xf;
    auVar49[0x1e] = 0xf;
    auVar49[0x1f] = 0xf;
    do {
      auVar32 = *(undefined1 (*) [32])((long)x + uVar9);
      auVar33 = *(undefined1 (*) [32])((long)x + uVar9 + 0x20);
      auVar8 = auVar32 ^ *(undefined1 (*) [32])((long)y + uVar9);
      auVar29 = auVar33 ^ *(undefined1 (*) [32])((long)y + uVar9 + 0x20);
      *(undefined1 (*) [32])((long)y + uVar9) = auVar8;
      *(undefined1 (*) [32])((long)y + uVar9 + 0x20) = auVar29;
      auVar51 = vpsrlq_avx2(auVar8,4);
      auVar8 = vpand_avx2(auVar8,auVar49);
      auVar31 = vpshufb_avx2(auVar34,auVar8);
      auVar30 = vpshufb_avx2(auVar3,auVar8);
      auVar8 = vpand_avx2(auVar51,auVar49);
      auVar51 = vpshufb_avx2(auVar47,auVar8);
      auVar7 = vpshufb_avx2(auVar4,auVar8);
      auVar28 = vpsrlq_avx512vl(auVar29,4);
      auVar8 = vpand_avx2(auVar29,auVar49);
      auVar29 = vpshufb_avx512vl(auVar48,auVar8);
      auVar51 = vpternlogq_avx512vl(auVar29,auVar51,auVar31,0x96);
      auVar8 = vpshufb_avx2(auVar5,auVar8);
      auVar30 = vpternlogq_avx512vl(auVar8,auVar7,auVar30,0x96);
      auVar31 = vpandq_avx512vl(auVar28,auVar49);
      auVar8 = vpshufb_avx2(auVar2,auVar31);
      auVar31 = vpshufb_avx2(auVar6,auVar31);
      auVar32 = vpternlogq_avx512vl(auVar8,auVar32,auVar51,0x96);
      auVar33 = vpternlogq_avx512vl(auVar31,auVar33,auVar30,0x96);
      *(undefined1 (*) [32])((long)x + uVar9) = auVar32;
      *(undefined1 (*) [32])((long)x + uVar9 + 0x20) = auVar33;
      uVar9 = uVar9 + 0x40;
    } while (bytes != uVar9);
  }
  else if (CpuHasSSSE3 == '\x01') {
    lVar10 = (ulong)log_m * 0x80;
    auVar1 = *(undefined1 (*) [16])(Multiply128LUT + lVar10);
    auVar18 = *(undefined1 (*) [16])(Multiply128LUT + 0x10 + lVar10);
    auVar19 = *(undefined1 (*) [16])(Multiply128LUT + 0x20 + lVar10);
    auVar20 = *(undefined1 (*) [16])(Multiply128LUT + 0x30 + lVar10);
    auVar21 = *(undefined1 (*) [16])(Multiply128LUT + 0x40 + lVar10);
    auVar22 = *(undefined1 (*) [16])(Multiply128LUT + 0x50 + lVar10);
    auVar23 = *(undefined1 (*) [16])(Multiply128LUT + 0x60 + lVar10);
    auVar24 = *(undefined1 (*) [16])(Multiply128LUT + 0x70 + lVar10);
    uVar9 = 0;
    auVar25[8] = 0xf;
    auVar25._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar25[9] = 0xf;
    auVar25[10] = 0xf;
    auVar25[0xb] = 0xf;
    auVar25[0xc] = 0xf;
    auVar25[0xd] = 0xf;
    auVar25[0xe] = 0xf;
    auVar25[0xf] = 0xf;
    do {
      auVar16 = *(undefined1 (*) [16])((long)x + uVar9 + 0x10);
      auVar17 = *(undefined1 (*) [16])((long)x + uVar9 + 0x30);
      auVar26 = auVar16 ^ *(undefined1 (*) [16])((long)y + uVar9 + 0x10);
      auVar13 = auVar17 ^ *(undefined1 (*) [16])((long)y + uVar9 + 0x30);
      *(undefined1 (*) [16])((long)y + uVar9 + 0x10) = auVar26;
      *(undefined1 (*) [16])((long)y + uVar9 + 0x30) = auVar13;
      auVar50 = vpsrlq_avx(auVar26,4);
      auVar26 = vpand_avx(auVar26,auVar25);
      auVar15 = vpshufb_avx(auVar1,auVar26);
      auVar14 = vpshufb_avx(auVar21,auVar26);
      auVar26 = vpand_avx(auVar50,auVar25);
      auVar50 = vpshufb_avx(auVar18,auVar26);
      auVar27 = vpshufb_avx(auVar22,auVar26);
      auVar12 = vpsrlq_avx512vl(auVar13,4);
      auVar26 = vpand_avx(auVar13,auVar25);
      auVar13 = vpshufb_avx512vl(auVar19,auVar26);
      auVar50 = vpternlogq_avx512vl(auVar13,auVar50,auVar15,0x96);
      auVar26 = vpshufb_avx(auVar23,auVar26);
      auVar14 = vpternlogq_avx512vl(auVar26,auVar27,auVar14,0x96);
      auVar15 = vpandq_avx512vl(auVar12,auVar25);
      auVar26 = vpshufb_avx(auVar20,auVar15);
      auVar15 = vpshufb_avx(auVar24,auVar15);
      auVar16 = vpternlogq_avx512vl(auVar26,auVar16,auVar50,0x96);
      auVar17 = vpternlogq_avx512vl(auVar15,auVar17,auVar14,0x96);
      *(undefined1 (*) [16])((long)x + uVar9 + 0x10) = auVar16;
      *(undefined1 (*) [16])((long)x + uVar9 + 0x30) = auVar17;
      auVar16 = *(undefined1 (*) [16])((long)x + uVar9);
      auVar17 = *(undefined1 (*) [16])((long)x + uVar9 + 0x20);
      auVar26 = auVar16 ^ *(undefined1 (*) [16])((long)y + uVar9);
      auVar13 = auVar17 ^ *(undefined1 (*) [16])((long)y + uVar9 + 0x20);
      *(undefined1 (*) [16])((long)y + uVar9) = auVar26;
      *(undefined1 (*) [16])((long)y + uVar9 + 0x20) = auVar13;
      auVar50 = vpsrlq_avx(auVar26,4);
      auVar26 = vpand_avx(auVar26,auVar25);
      auVar15 = vpshufb_avx(auVar1,auVar26);
      auVar14 = vpshufb_avx(auVar21,auVar26);
      auVar26 = vpand_avx(auVar50,auVar25);
      auVar50 = vpshufb_avx(auVar18,auVar26);
      auVar27 = vpshufb_avx(auVar22,auVar26);
      auVar12 = vpsrlq_avx512vl(auVar13,4);
      auVar26 = vpand_avx(auVar13,auVar25);
      auVar13 = vpshufb_avx512vl(auVar19,auVar26);
      auVar50 = vpternlogq_avx512vl(auVar13,auVar50,auVar15,0x96);
      auVar26 = vpshufb_avx(auVar23,auVar26);
      auVar14 = vpternlogq_avx512vl(auVar26,auVar27,auVar14,0x96);
      auVar15 = vpandq_avx512vl(auVar12,auVar25);
      auVar26 = vpshufb_avx(auVar20,auVar15);
      auVar15 = vpshufb_avx(auVar24,auVar15);
      auVar16 = vpternlogq_avx512vl(auVar26,auVar16,auVar50,0x96);
      auVar17 = vpternlogq_avx512vl(auVar15,auVar17,auVar14,0x96);
      *(undefined1 (*) [16])((long)x + uVar9) = auVar16;
      *(undefined1 (*) [16])((long)x + uVar9 + 0x20) = auVar17;
      uVar9 = uVar9 + 0x40;
    } while (bytes != uVar9);
  }
  else {
    xor_mem(y,x,bytes);
    lVar10 = (ulong)log_m * 0x80 + Multiply16LUT;
    uVar9 = 0;
    auVar35 = vpbroadcastd_avx512f(ZEXT416(0xf));
    auVar36 = vpbroadcastd_avx512f(ZEXT416(0x10));
    auVar37 = vpbroadcastd_avx512f(ZEXT416(0x20));
    auVar38 = vpbroadcastd_avx512f(ZEXT416(0x30));
    uVar11 = extraout_RDX;
    do {
      auVar39 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar9 + 0x20));
      auVar40 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar9));
      auVar41 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar9 + 0x60));
      auVar42 = vpmovzxbd_avx512f(*(undefined1 (*) [16])((long)y + uVar9 + 0x40));
      auVar43 = vpandd_avx512f(auVar40,auVar35);
      auVar44 = vpandd_avx512f(auVar39,auVar35);
      auVar34 = vextracti64x4_avx512f(auVar44,1);
      auVar45 = vpmovzxdq_avx512f(auVar34);
      auVar44 = vpmovzxdq_avx512f(auVar44._0_32_);
      auVar34 = vextracti64x4_avx512f(auVar43,1);
      auVar46 = vpmovzxdq_avx512f(auVar34);
      auVar43 = vpmovzxdq_avx512f(auVar43._0_32_);
      auVar1 = vpinsrw_avx(ZEXT216(*(ushort *)
                                    (lVar10 + CONCAT44((int)(uVar11 >> 0x20),auVar45._0_4_) * 2)),
                           (uint)*(ushort *)(lVar10 + (ulong)auVar45._8_4_ * 2),1);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar45._16_4_ * 2),2);
      auVar18 = vextracti32x4_avx512f(auVar45,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar45._24_4_ * 2),3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar18._0_4_ * 2),4);
      auVar19 = vextracti32x4_avx512f(auVar45,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar18._8_4_ * 2),5);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar19._0_4_ * 2),6);
      auVar1 = vpinsrw_avx(auVar1,(uint)*(ushort *)(lVar10 + (ulong)auVar19._8_4_ * 2),7);
      auVar18 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar44._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar44._8_4_ * 2),1);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar44._16_4_ * 2),2);
      auVar19 = vextracti32x4_avx512f(auVar44,2);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar44._24_4_ * 2),3);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar19._0_4_ * 2),4);
      auVar20 = vextracti32x4_avx512f(auVar44,3);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar19._8_4_ * 2),5);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar20._0_4_ * 2),6);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(lVar10 + (ulong)auVar20._8_4_ * 2),7);
      auVar19 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar46._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar46._8_4_ * 2),1);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar46._16_4_ * 2),2);
      auVar20 = vextracti32x4_avx512f(auVar46,2);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar46._24_4_ * 2),3);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar20._0_4_ * 2),4);
      auVar21 = vextracti32x4_avx512f(auVar46,3);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar20._8_4_ * 2),5);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar21._0_4_ * 2),6);
      auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(lVar10 + (ulong)auVar21._8_4_ * 2),7);
      auVar20 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar43._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar43._8_4_ * 2),1);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar43._16_4_ * 2),2);
      auVar21 = vextracti32x4_avx512f(auVar43,2);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar43._24_4_ * 2),3);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar21._0_4_ * 2),4);
      auVar22 = vextracti32x4_avx512f(auVar43,3);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar21._8_4_ * 2),5);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar22._0_4_ * 2),6);
      auVar20 = vpinsrw_avx(auVar20,(uint)*(ushort *)(lVar10 + (ulong)auVar22._8_4_ * 2),7);
      auVar39 = vpsrld_avx512f(auVar39,4);
      auVar40 = vpsrld_avx512f(auVar40,4);
      auVar40 = vpord_avx512f(auVar40,auVar36);
      auVar39 = vpord_avx512f(auVar39,auVar36);
      auVar34 = vextracti64x4_avx512f(auVar39,1);
      auVar43 = vpmovzxdq_avx512f(auVar34);
      auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
      auVar34 = vextracti64x4_avx512f(auVar40,1);
      auVar44 = vpmovzxdq_avx512f(auVar34);
      auVar40 = vpmovzxdq_avx512f(auVar40._0_32_);
      auVar21 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar43._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar43._8_4_ * 2),1);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar43._16_4_ * 2),2);
      auVar22 = vextracti32x4_avx512f(auVar43,2);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar43._24_4_ * 2),3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar22._0_4_ * 2),4);
      auVar23 = vextracti32x4_avx512f(auVar43,3);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar22._8_4_ * 2),5);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar23._0_4_ * 2),6);
      auVar21 = vpinsrw_avx(auVar21,(uint)*(ushort *)(lVar10 + (ulong)auVar23._8_4_ * 2),7);
      auVar22 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar39._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar39._8_4_ * 2),1);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar39._16_4_ * 2),2);
      auVar23 = vextracti32x4_avx512f(auVar39,2);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar39._24_4_ * 2),3);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar23._0_4_ * 2),4);
      auVar24 = vextracti32x4_avx512f(auVar39,3);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar23._8_4_ * 2),5);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar24._0_4_ * 2),6);
      auVar22 = vpinsrw_avx(auVar22,(uint)*(ushort *)(lVar10 + (ulong)auVar24._8_4_ * 2),7);
      auVar23 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar44._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar44._8_4_ * 2),1);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar44._16_4_ * 2),2);
      auVar24 = vextracti32x4_avx512f(auVar44,2);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar44._24_4_ * 2),3);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar24._0_4_ * 2),4);
      auVar25 = vextracti32x4_avx512f(auVar44,3);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar24._8_4_ * 2),5);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar25._0_4_ * 2),6);
      auVar23 = vpinsrw_avx(auVar23,(uint)*(ushort *)(lVar10 + (ulong)auVar25._8_4_ * 2),7);
      auVar24 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar40._0_4_ * 2)),
                            (uint)*(ushort *)(lVar10 + (ulong)auVar40._8_4_ * 2),1);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar40._16_4_ * 2),2);
      auVar25 = vextracti32x4_avx512f(auVar40,2);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar40._24_4_ * 2),3);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar25._0_4_ * 2),4);
      auVar16 = vextracti32x4_avx512f(auVar40,3);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar25._8_4_ * 2),5);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar16._0_4_ * 2),6);
      auVar24 = vpinsrw_avx(auVar24,(uint)*(ushort *)(lVar10 + (ulong)auVar16._8_4_ * 2),7);
      auVar39 = vmovdqa64_avx512f(auVar37);
      auVar39 = vpternlogd_avx512f(auVar39,auVar42,auVar35,0xf8);
      auVar40 = vmovdqa64_avx512f(auVar37);
      auVar40 = vpternlogd_avx512f(auVar40,auVar41,auVar35,0xf8);
      auVar34 = vextracti64x4_avx512f(auVar40,1);
      auVar43 = vpmovzxdq_avx512f(auVar34);
      auVar40 = vpmovzxdq_avx512f(auVar40._0_32_);
      auVar34 = vextracti64x4_avx512f(auVar39,1);
      auVar44 = vpmovzxdq_avx512f(auVar34);
      auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
      auVar16 = vextracti32x4_avx512vl(auVar43._0_32_,1);
      auVar25 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar43._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar43._8_4_ * 2),1);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar16._0_4_ * 2),2);
      auVar17 = vextracti32x4_avx512f(auVar43,2);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar16._8_4_ * 2),3);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar17._0_4_ * 2),4);
      auVar16 = vextracti32x4_avx512f(auVar43,3);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar17._8_4_ * 2),5);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar16._0_4_ * 2),6);
      auVar25 = vpinsrw_avx512bw(auVar25,(uint)*(ushort *)(lVar10 + (ulong)auVar16._8_4_ * 2),7);
      auVar17 = vextracti32x4_avx512vl(auVar40._0_32_,1);
      auVar16 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar40._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar40._8_4_ * 2),1);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar17._0_4_ * 2),2);
      auVar26 = vextracti32x4_avx512f(auVar40,2);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar17._8_4_ * 2),3);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar26._0_4_ * 2),4);
      auVar17 = vextracti32x4_avx512f(auVar40,3);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar26._8_4_ * 2),5);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar17._0_4_ * 2),6);
      auVar16 = vpinsrw_avx512bw(auVar16,(uint)*(ushort *)(lVar10 + (ulong)auVar17._8_4_ * 2),7);
      auVar26 = vextracti32x4_avx512vl(auVar44._0_32_,1);
      auVar17 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar44._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar44._8_4_ * 2),1);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar26._0_4_ * 2),2);
      auVar15 = vextracti32x4_avx512f(auVar44,2);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar26._8_4_ * 2),3);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar15._0_4_ * 2),4);
      auVar26 = vextracti32x4_avx512f(auVar44,3);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar15._8_4_ * 2),5);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar26._0_4_ * 2),6);
      auVar17 = vpinsrw_avx512bw(auVar17,(uint)*(ushort *)(lVar10 + (ulong)auVar26._8_4_ * 2),7);
      auVar15 = vextracti32x4_avx512vl(auVar39._0_32_,1);
      auVar26 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar39._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar39._8_4_ * 2),1);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar15._0_4_ * 2),2);
      auVar14 = vextracti32x4_avx512f(auVar39,2);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar15._8_4_ * 2),3);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar14._0_4_ * 2),4);
      auVar15 = vextracti32x4_avx512f(auVar39,3);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar14._8_4_ * 2),5);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar15._0_4_ * 2),6);
      auVar26 = vpinsrw_avx512bw(auVar26,(uint)*(ushort *)(lVar10 + (ulong)auVar15._8_4_ * 2),7);
      auVar39 = vpsrld_avx512f(auVar41,4);
      auVar40 = vpsrld_avx512f(auVar42,4);
      auVar40 = vpord_avx512f(auVar40,auVar38);
      auVar39 = vpord_avx512f(auVar39,auVar38);
      auVar34 = vextracti64x4_avx512f(auVar39,1);
      auVar41 = vpmovzxdq_avx512f(auVar34);
      auVar39 = vpmovzxdq_avx512f(auVar39._0_32_);
      auVar34 = vextracti64x4_avx512f(auVar40,1);
      auVar42 = vpmovzxdq_avx512f(auVar34);
      auVar40 = vpmovzxdq_avx512f(auVar40._0_32_);
      auVar14 = vextracti32x4_avx512vl(auVar41._0_32_,1);
      auVar15 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar41._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar41._8_4_ * 2),1);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar14._0_4_ * 2),2);
      auVar50 = vextracti32x4_avx512f(auVar41,2);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar14._8_4_ * 2),3);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar50._0_4_ * 2),4);
      auVar14 = vextracti32x4_avx512f(auVar41,3);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar50._8_4_ * 2),5);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar14._0_4_ * 2),6);
      auVar15 = vpinsrw_avx512bw(auVar15,(uint)*(ushort *)(lVar10 + (ulong)auVar14._8_4_ * 2),7);
      auVar50 = vextracti32x4_avx512vl(auVar39._0_32_,1);
      auVar14 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar39._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar39._8_4_ * 2),1);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar50._0_4_ * 2),2);
      auVar27 = vextracti32x4_avx512f(auVar39,2);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar50._8_4_ * 2),3);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar27._0_4_ * 2),4);
      auVar50 = vextracti32x4_avx512f(auVar39,3);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar27._8_4_ * 2),5);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar50._0_4_ * 2),6);
      auVar14 = vpinsrw_avx512bw(auVar14,(uint)*(ushort *)(lVar10 + (ulong)auVar50._8_4_ * 2),7);
      auVar27 = vextracti32x4_avx512vl(auVar42._0_32_,1);
      auVar50 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar42._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar42._8_4_ * 2),1);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar27._0_4_ * 2),2);
      auVar13 = vextracti32x4_avx512f(auVar42,2);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar27._8_4_ * 2),3);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar13._0_4_ * 2),4);
      auVar27 = vextracti32x4_avx512f(auVar42,3);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar13._8_4_ * 2),5);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar27._0_4_ * 2),6);
      auVar50 = vpinsrw_avx512bw(auVar50,(uint)*(ushort *)(lVar10 + (ulong)auVar27._8_4_ * 2),7);
      auVar13 = vextracti32x4_avx512vl(auVar40._0_32_,1);
      auVar27 = vpinsrw_avx512bw(ZEXT216(*(ushort *)(lVar10 + (ulong)auVar40._0_4_ * 2)),
                                 (uint)*(ushort *)(lVar10 + (ulong)auVar40._8_4_ * 2),1);
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + (ulong)auVar13._0_4_ * 2),2);
      auVar12 = vextracti32x4_avx512f(auVar40,2);
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + (ulong)auVar13._8_4_ * 2),3);
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + (ulong)auVar12._0_4_ * 2),4);
      auVar13 = vextracti32x4_avx512f(auVar40,3);
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + (ulong)auVar12._8_4_ * 2),5);
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + (ulong)auVar13._0_4_ * 2),6);
      uVar11 = (ulong)auVar13._8_4_;
      auVar27 = vpinsrw_avx512bw(auVar27,(uint)*(ushort *)(lVar10 + uVar11 * 2),7);
      auVar34._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar18;
      auVar34._16_16_ = ZEXT116(1) * auVar1;
      auVar39 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar19,
                                               ZEXT116(0) * auVar19 + ZEXT116(1) * auVar20)),auVar34
                           ,1);
      auVar47._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar22;
      auVar47._16_16_ = ZEXT116(1) * auVar21;
      auVar40 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar23,
                                               ZEXT116(0) * auVar23 + ZEXT116(1) * auVar24)),auVar47
                           ,1);
      auVar39 = vpxorq_avx512f(auVar40,auVar39);
      auVar48._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar16;
      auVar48._16_16_ = ZEXT116(1) * auVar25;
      auVar34 = vinserti32x4_avx512vl(ZEXT1632(auVar26),auVar17,1);
      auVar40 = vinserti64x4_avx512f(ZEXT3264(auVar34),auVar48,1);
      auVar34 = vinserti32x4_avx512vl(ZEXT1632(auVar14),auVar15,1);
      auVar41 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar50,
                                               ZEXT116(0) * auVar50 + ZEXT116(1) * auVar27)),auVar34
                           ,1);
      auVar39 = vpternlogq_avx512f(auVar41,auVar39,auVar40,0x96);
      auVar34 = vpmovwb_avx512bw(auVar39);
      *(undefined1 (*) [32])((long)x + uVar9) = auVar34 ^ *(undefined1 (*) [32])((long)x + uVar9);
      auVar39 = vpsrlw_avx512bw(auVar39,8);
      auVar34 = vpmovwb_avx512bw(auVar39);
      *(undefined1 (*) [32])((long)x + uVar9 + 0x20) =
           auVar34 ^ *(undefined1 (*) [32])((long)x + uVar9 + 0x20);
      uVar9 = uVar9 + 0x40;
    } while (bytes != uVar9);
  }
  return;
}

Assistant:

static void IFFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_IFFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); }

            LEO_IFFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_IFFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); }

            LEO_IFFTB_128(x16 + 1, y16 + 1);
            LEO_IFFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    xor_mem(y, x, bytes);
    RefMulAdd(x, y, log_m, bytes);
}